

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pUVar3;
  undefined8 uVar4;
  pointer pUVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar9 = 0;
  if (0 < num) {
    uVar9 = (ulong)(uint)num;
  }
  lVar7 = (long)start << 4;
  uVar6 = uVar9;
  while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
    UnknownField::Delete
              ((UnknownField *)
               ((long)&((this->fields_).
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        ._M_impl.super__Vector_impl_data._M_start)->number_ + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  uVar6 = (ulong)(start + num);
  lVar7 = uVar6 << 4;
  while( true ) {
    pUVar3 = (this->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pUVar5 = (this->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pUVar5 - (long)pUVar3 >> 4) <= uVar6) break;
    puVar1 = (undefined8 *)((long)&pUVar3->number_ + lVar7);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pUVar3[-(long)num].number_ + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x10;
  }
  while( true ) {
    pUVar5 = pUVar5 + -1;
    iVar8 = (int)uVar9;
    uVar9 = (ulong)(iVar8 - 1);
    if (iVar8 == 0) break;
    (this->fields_).
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar5;
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_.size(); ++i) {
    (fields_)[i - num] = (fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_.pop_back();
  }
}